

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

any * __thiscall
Omega_h::InputYamlReader::seq_next_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *items,any *next_item)

{
  _func_int **pp_Var1;
  char *pcVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  type_info *ptVar6;
  InputMap *pIVar7;
  undefined8 *puVar8;
  ParserFail *this_00;
  shared_ptr<Omega_h::Input> sptr;
  InputMap value;
  InputList list;
  shared_ptr<Omega_h::Input> local_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
  _Stack_88;
  undefined1 local_58 [24];
  vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
  local_40;
  
  bVar4 = any::is_typed(items,(type_info *)&InputList::typeinfo);
  if ((!bVar4) || ((InputList *)(items->storage).dynamic == (InputList *)0x0)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = &PTR__bad_cast_004b86a8;
    __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  InputList::InputList((InputList *)local_58,(InputList *)(items->storage).dynamic);
  if (next_item->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*next_item->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar6 + 8);
  if (pcVar2 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_002ee437:
    bVar4 = any::is_typed(next_item,(type_info *)&std::__cxx11::string::typeinfo);
    if ((!bVar4) || (plVar3 = (long *)(next_item->storage).dynamic, plVar3 == (long *)0x0)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pp_Var1 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var1) {
      local_90 = (undefined1  [8])*pp_Var1;
      _Stack_88._M_impl._0_8_ = plVar3[3];
      local_a0._0_8_ = local_90;
    }
    else {
      local_90 = (undefined1  [8])*pp_Var1;
      local_a0._0_8_ = (_func_int **)*plVar3;
    }
    local_a0._8_8_ = plVar3[1];
    *plVar3 = (long)pp_Var1;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    pIVar7 = (InputMap *)operator_new(0x38);
    InputScalar::InputScalar((InputScalar *)pIVar7,(string *)local_a0);
    local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pIVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::InputScalar*>
              (&local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (InputScalar *)pIVar7);
    ((Input *)
    &(local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Input)
    ->parent = (Input *)local_58;
    std::vector<std::shared_ptr<Omega_h::Input>,std::allocator<std::shared_ptr<Omega_h::Input>>>::
    emplace_back<std::shared_ptr<Omega_h::Input>>
              ((vector<std::shared_ptr<Omega_h::Input>,std::allocator<std::shared_ptr<Omega_h::Input>>>
                *)&local_40,&local_b0);
    if (local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if ((undefined1 *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)((long)local_90 + 1));
    }
    goto LAB_002ee6b5;
  }
  if (*pcVar2 != '*') {
    iVar5 = strcmp(pcVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
    if (iVar5 == 0) goto LAB_002ee437;
  }
  if (next_item->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*next_item->vtable->type)();
  }
  pcVar2 = *(char **)(ptVar6 + 8);
  if (pcVar2 == "N7Omega_h9InputListE") {
LAB_002ee4c3:
    bVar4 = any::is_typed(next_item,(type_info *)&InputList::typeinfo);
    if ((!bVar4) || ((InputList *)(next_item->storage).dynamic == (InputList *)0x0)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    InputList::InputList((InputList *)local_a0,(InputList *)(next_item->storage).dynamic);
    pIVar7 = (InputMap *)operator_new(0x30);
    InputList::InputList((InputList *)pIVar7,(InputList *)local_a0);
    local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pIVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::InputList*>
              (&local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (InputList *)pIVar7);
    ((Input *)
    &(local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Input)
    ->parent = (Input *)local_58;
    std::vector<std::shared_ptr<Omega_h::Input>,std::allocator<std::shared_ptr<Omega_h::Input>>>::
    emplace_back<std::shared_ptr<Omega_h::Input>>
              ((vector<std::shared_ptr<Omega_h::Input>,std::allocator<std::shared_ptr<Omega_h::Input>>>
                *)&local_40,&local_b0);
    if (local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    local_a0._0_8_ = &PTR__InputList_004b9870;
    std::vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ::~vector((vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
               *)(local_90 + 8));
  }
  else {
    if (*pcVar2 != '*') {
      iVar5 = strcmp(pcVar2,"N7Omega_h9InputListE");
      if (iVar5 == 0) goto LAB_002ee4c3;
    }
    if (next_item->vtable == (vtable_type *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar6 = (*next_item->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar6 + 8);
    if (pcVar2 != "N7Omega_h8InputMapE") {
      if (*pcVar2 == '*') {
LAB_002ee7b1:
        this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
        local_a0._0_8_ = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"bug in InputYamlReader: unexpected type for sequence item",""
                  );
        ParserFail::ParserFail(this_00,(string *)local_a0);
        __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      iVar5 = strcmp(pcVar2,"N7Omega_h8InputMapE");
      if (iVar5 != 0) goto LAB_002ee7b1;
    }
    bVar4 = any::is_typed(next_item,(type_info *)&InputMap::typeinfo);
    if ((!bVar4) || ((InputMap *)(next_item->storage).dynamic == (InputMap *)0x0)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    InputMap::InputMap((InputMap *)local_a0,(InputMap *)(next_item->storage).dynamic);
    pIVar7 = (InputMap *)operator_new(0x48);
    InputMap::InputMap(pIVar7,(InputMap *)local_a0);
    local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pIVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::InputMap*>
              (&local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pIVar7);
    ((Input *)
    &(local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Input)
    ->parent = (Input *)local_58;
    std::vector<std::shared_ptr<Omega_h::Input>,std::allocator<std::shared_ptr<Omega_h::Input>>>::
    emplace_back<std::shared_ptr<Omega_h::Input>>
              ((vector<std::shared_ptr<Omega_h::Input>,std::allocator<std::shared_ptr<Omega_h::Input>>>
                *)&local_40,&local_b0);
    if (local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    local_a0._0_8_ = &PTR__InputMap_004b9848;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
                 *)(local_90 + 8));
  }
LAB_002ee6b5:
  __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::InputList>()::table;
  any::do_construct<Omega_h::InputList,Omega_h::InputList>
            (__return_storage_ptr__,(InputList *)local_58);
  local_58._0_8_ = &PTR__InputList_004b9870;
  std::vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>::
  ~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

any seq_next_item(any& items, any& next_item) {
    auto list = any_cast<InputList&&>(std::move(items));
    if (next_item.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputScalar(std::move(value)));
      list.add(std::move(sptr));
    } else if (next_item.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputList(std::move(value)));
      list.add(std::move(sptr));
    } else if (next_item.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputMap(std::move(value)));
      list.add(std::move(sptr));
    } else {
      throw ParserFail(
          "bug in InputYamlReader: unexpected type for sequence item");
    }
    return any(std::move(list));
  }